

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFactoryRegistry.cpp
# Opt level: O3

void __thiscall
CppUnit::TestFactoryRegistry::TestFactoryRegistry(TestFactoryRegistry *this,string *name)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  (this->super_TestFactory)._vptr_TestFactory = (_func_int **)&PTR__TestFactoryRegistry_00142ff0;
  p_Var1 = &(this->m_factories)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->m_factories)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_factories)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_factories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_factories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_factories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_factories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar2,pcVar2 + name->_M_string_length);
  return;
}

Assistant:

TestFactoryRegistry::TestFactoryRegistry( std::string name ) :
    m_factories(),
    m_name( name )
{
}